

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O1

void cave_free(chunk_conflict *c)

{
  object *obj;
  _Bool _Var1;
  loc grid;
  long lVar2;
  long lVar3;
  long lVar4;
  chunk *p_c;
  ulong uVar5;
  
  if (player == (player *)0x0 || cave != c) {
    p_c = (chunk *)0x0;
  }
  else {
    p_c = (chunk *)player->cave;
  }
  cave_connectors_free(c->join);
  if (1 < c->obj_max) {
    uVar5 = 1;
    lVar2 = 8;
    do {
      lVar3 = *(long *)((long)c->objects + lVar2);
      if (lVar3 != 0) {
        _Var1 = loc_is_zero(*(loc_conflict *)(lVar3 + 0x34));
        if (_Var1) {
          object_delete((chunk *)c,p_c,(object **)((long)c->objects + lVar2));
        }
      }
      uVar5 = uVar5 + 1;
      lVar2 = lVar2 + 8;
    } while (uVar5 < c->obj_max);
  }
  if (0 < c->height) {
    lVar2 = 0;
    do {
      if (0 < c->width) {
        lVar4 = 0;
        lVar3 = 0;
        do {
          mem_free(*(void **)((long)&c->squares[lVar2]->info + lVar4));
          if (*(long *)((long)&c->squares[lVar2]->trap + lVar4) != 0) {
            grid = (loc)loc((int)lVar3,(int)lVar2);
            square_free_trap((chunk *)c,grid);
          }
          obj = *(object **)((long)&c->squares[lVar2]->obj + lVar4);
          if (obj != (object *)0x0) {
            object_pile_free((chunk *)c,p_c,obj);
          }
          lVar3 = lVar3 + 1;
          lVar4 = lVar4 + 0x28;
        } while (lVar3 < c->width);
      }
      mem_free(c->squares[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < c->height);
  }
  mem_free(c->squares);
  heatmap_free(c,(heatmap)(c->noise).grids);
  heatmap_free(c,(heatmap)(c->scent).grids);
  mem_free(c->feat_count);
  mem_free(c->objects);
  mem_free(c->monsters);
  mem_free(c->monster_groups);
  if (c->ghost != (ghost_info *)0x0) {
    mem_free(c->ghost);
  }
  if (c->name != (char *)0x0) {
    string_free(c->name);
  }
  mem_free(c);
  return;
}

Assistant:

void cave_free(struct chunk *c) {
	struct chunk *p_c = (c == cave && player) ? player->cave : NULL;
	int y, x, i;

	cave_connectors_free(c->join);

	/* Look for orphaned objects and delete them. */
	for (i = 1; i < c->obj_max; i++) {
		if (c->objects[i] && loc_is_zero(c->objects[i]->grid)) {
			object_delete(c, p_c, &c->objects[i]);
		}
	}

	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			mem_free(c->squares[y][x].info);
			if (c->squares[y][x].trap)
				square_free_trap(c, loc(x, y));
			if (c->squares[y][x].obj)
				object_pile_free(c, p_c, c->squares[y][x].obj);
		}
		mem_free(c->squares[y]);
	}
	mem_free(c->squares);
	heatmap_free(c, c->noise);
	heatmap_free(c, c->scent);

	mem_free(c->feat_count);
	mem_free(c->objects);
	mem_free(c->monsters);
	mem_free(c->monster_groups);
	if (c->ghost) {
		mem_free(c->ghost);
	}
	if (c->name)
		string_free(c->name);
	mem_free(c);
}